

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

byte * __thiscall
Js::ByteCodeBufferReader::DeserializeVarArray<Js::AuxArray<void*>>
          (ByteCodeBufferReader *this,ScriptContext *scriptContext,byte *buffer,
          ByteBlock *deserializeInto)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  byte *pbVar8;
  Var pvVar9;
  ulong uVar10;
  byte *pbVar11;
  undefined8 local_40;
  int8 value;
  byte local_31 [8];
  byte code;
  
  uVar1 = *(uint *)buffer;
  uVar5 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar5 <= (ulong)uVar1 + 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1261,
                                "(serialized->offset + sizeof(T) < deserializeInto->GetLength())",
                                "serialized->offset + sizeof(T) < deserializeInto->GetLength()");
    if (!bVar4) goto LAB_007c6c9b;
    *puVar7 = 0;
  }
  pbVar8 = ByteBlock::GetBuffer(deserializeInto);
  uVar1 = *(uint *)buffer;
  uVar2 = *(uint *)(buffer + 5);
  *(uint *)(pbVar8 + uVar1) = uVar2;
  uVar6 = *(uint *)buffer;
  uVar5 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar5 < (ulong)uVar6 + (ulong)uVar2 * 8 + 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1265,
                                "(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength())"
                                ,
                                "serialized->offset + result->GetDataSize() <= deserializeInto->GetLength()"
                               );
    if (!bVar4) {
LAB_007c6c9b:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  pbVar11 = buffer + 9;
  uVar10 = 0;
  do {
    if (uVar2 == uVar10) {
      return pbVar11;
    }
    pbVar11 = ReadByte(this,pbVar11,local_31);
    switch(local_31[0]) {
    case 1:
      pbVar11 = ReadByte(this,pbVar11,(byte *)&local_40);
      uVar6 = (uint)(char)(byte)local_40;
      break;
    case 2:
      pbVar11 = ReadConstantSizedInt16(this,pbVar11,(int16 *)&local_40);
      uVar6 = (uint)CONCAT11(local_40._1_1_,(byte)local_40);
      break;
    case 3:
      pbVar11 = ReadConstantSizedInt32(this,pbVar11,(int *)&local_40);
      uVar6 = CONCAT22(local_40._2_2_,CONCAT11(local_40._1_1_,(byte)local_40));
      break;
    case 4:
      pbVar11 = ReadDouble(this,pbVar11,(double *)&local_40);
      pvVar9 = JavascriptNumber::ToVar
                         ((double)CONCAT44(local_40._4_4_,
                                           CONCAT22(local_40._2_2_,
                                                    CONCAT11(local_40._1_1_,(byte)local_40))));
      goto LAB_007c6c26;
    default:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x1291,"((0))","Unexpected object type in VarArray");
      if (bVar4) {
        *puVar7 = 0;
        Throw::FatalInternalError(-0x7fffbffb);
      }
      goto LAB_007c6c9b;
    }
    pvVar9 = (Var)((ulong)uVar6 | 0x1000000000000);
LAB_007c6c26:
    *(Var *)(pbVar8 + uVar10 * 8 + (ulong)uVar1 + 8) = pvVar9;
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

const byte * DeserializeVarArray(ScriptContext * scriptContext, const byte * buffer, ByteBlock * deserializeInto)
    {
        auto serialized = (serialization_alignment const Js::SerializedVarArray *)buffer;
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        Assert(serialized->magic == magicStartOfAuxVarArray);
#endif
        Assert(serialized->offset + sizeof(T) < deserializeInto->GetLength());
        auto result = (T *)(deserializeInto->GetBuffer() + serialized->offset);
        uint count = serialized->varCount;
        result->SetCount(count);
        Assert(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength());

        auto content = (const byte*)(serialized + 1);
        auto current = content;
        for (uint index = 0; index < count; index++)
        {
            byte code;
            current = ReadByte(current, &code);
            switch(code)
            {
                case ctInt32:
                    {
                        int value;
                        current = ReadConstantSizedInt32(current, &value);
                        result->elements[index] = Js::TaggedInt::ToVarUnchecked(value);
                        break;
                    }
                case ctInt16:
                    {
                        int16 value;
                        current = ReadConstantSizedInt16(current, &value);
                        result->elements[index] = Js::TaggedInt::ToVarUnchecked(value);
                        break;
                    }
                case ctInt8:
                    {
                        int8 value;
                        current = ReadByte(current, (byte *)&value);
                        result->elements[index] = Js::TaggedInt::ToVarUnchecked(value);
                        break;
                    }
                case ctNumber:
                    {
                        double value;
                        current = ReadDouble(current, &value);
                        const auto number = Js::JavascriptNumber::New(value, scriptContext);
#if !FLOATVAR
                        scriptContext->BindReference(number);
#endif
                        result->elements[index] = number;
                        break;
                    }

                default:
                    AssertMsg(UNREACHED, "Unexpected object type in VarArray");
                    Throw::FatalInternalError();
            }
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int magicEnd;
        current = ReadInt32(current, &magicEnd);
        Assert(magicEnd == magicEndOfAuxVarArray);
#endif
        return current;
    }